

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O2

nh_roles_info * nh_get_roles(void)

{
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  boolean bVar5;
  nh_roles_info *pnVar6;
  char **ppcVar7;
  char **ppcVar8;
  nh_bool *__s;
  short *psVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char **ppcVar16;
  Race *pRVar17;
  Gender *pGVar18;
  ulong uVar19;
  short *psVar20;
  bool bVar21;
  
  pnVar6 = (nh_roles_info *)xmalloc(0x50);
  pnVar6->num_roles = 0xe;
  pnVar6->num_races = 6;
  pnVar6->num_genders = 2;
  pnVar6->num_aligns = 3;
  ppcVar7 = (char **)xmalloc(0x70);
  ppcVar8 = (char **)xmalloc(pnVar6->num_roles << 3);
  uVar13 = 0;
  uVar19 = (ulong)(uint)pnVar6->num_roles;
  if (pnVar6->num_roles < 1) {
    uVar19 = uVar13;
  }
  ppcVar16 = &roles[0].name.f;
  for (; uVar19 != uVar13; uVar13 = uVar13 + 1) {
    pcVar2 = *ppcVar16;
    ppcVar7[uVar13] = ((RoleName *)(ppcVar16 + -1))->m;
    ppcVar8[uVar13] = pcVar2;
    ppcVar16 = ppcVar16 + 0x23;
  }
  pnVar6->rolenames_m = ppcVar7;
  pnVar6->rolenames_f = ppcVar8;
  ppcVar7 = (char **)xmalloc(pnVar6->num_races << 3);
  uVar13 = 0;
  uVar19 = (ulong)(uint)pnVar6->num_races;
  if (pnVar6->num_races < 1) {
    uVar19 = uVar13;
  }
  pRVar17 = races;
  for (; uVar19 != uVar13; uVar13 = uVar13 + 1) {
    ppcVar7[uVar13] = pRVar17->noun;
    pRVar17 = pRVar17 + 1;
  }
  pnVar6->racenames = ppcVar7;
  ppcVar7 = (char **)xmalloc(pnVar6->num_genders << 3);
  uVar13 = 0;
  uVar19 = (ulong)(uint)pnVar6->num_genders;
  if (pnVar6->num_genders < 1) {
    uVar19 = uVar13;
  }
  pGVar18 = genders;
  for (; uVar19 != uVar13; uVar13 = uVar13 + 1) {
    ppcVar7[uVar13] = pGVar18->adj;
    pGVar18 = pGVar18 + 1;
  }
  pnVar6->gendnames = ppcVar7;
  ppcVar7 = (char **)xmalloc(pnVar6->num_aligns << 3);
  uVar1 = pnVar6->num_aligns;
  lVar14 = 0;
  uVar19 = 0;
  if (0 < (int)uVar1) {
    uVar19 = (ulong)uVar1;
  }
  for (; uVar19 * 8 != lVar14; lVar14 = lVar14 + 8) {
    *(undefined8 *)((long)ppcVar7 + lVar14) = *(undefined8 *)((long)&aligns[0].adj + lVar14 * 4);
  }
  pnVar6->alignnames = ppcVar7;
  uVar3 = flags._148_8_;
  iVar10 = flags.init_race;
  pnVar6->def_role = flags.init_role;
  uVar4 = flags._148_8_;
  pnVar6->def_race = iVar10;
  flags.init_gend = (int)uVar3;
  flags.init_align = SUB84(uVar3,4);
  iVar10 = flags.init_align;
  pnVar6->def_gend = flags.init_gend;
  flags._148_8_ = uVar4;
  pnVar6->def_align = iVar10;
  iVar10 = uVar1 * pnVar6->num_roles * pnVar6->num_races * pnVar6->num_genders;
  __s = (nh_bool *)xmalloc(iVar10);
  uVar19 = 0;
  memset(__s,0,(long)iVar10);
  do {
    if ((long)pnVar6->num_roles <= (long)uVar19) {
      pnVar6->matrix = __s;
      return pnVar6;
    }
    psVar20 = &roles[uVar19].allow;
    for (uVar13 = 0; (long)uVar13 < (long)pnVar6->num_races; uVar13 = uVar13 + 1) {
      bVar5 = ok_race((int)uVar19,(int)uVar13,-1,-1);
      if (bVar5 != '\0') {
        psVar9 = &races[uVar13].allow;
        for (uVar11 = 0; (long)uVar11 < (long)pnVar6->num_genders; uVar11 = uVar11 + 1) {
          if (uVar11 < 2) {
            uVar12 = genders[uVar11].allow;
            if (uVar19 < 0xe) {
              uVar12 = uVar12 & *psVar20;
            }
            if (uVar13 < 6) {
              uVar12 = uVar12 & *psVar9;
            }
            if (0xfff < uVar12) {
              for (uVar15 = 0; (long)uVar15 < (long)pnVar6->num_aligns; uVar15 = uVar15 + 1) {
                if (uVar15 < 3) {
                  uVar12 = aligns[uVar15].allow;
                  if (uVar19 < 0xe) {
                    uVar12 = uVar12 & *psVar20;
                  }
                  if (uVar13 < 6) {
                    uVar12 = uVar12 & *psVar9;
                  }
                  bVar21 = (uVar12 & 7) != 0;
                }
                else {
                  lVar14 = 0x38;
                  do {
                    if (lVar14 + 0x58 == 0x198) {
                      bVar21 = false;
                      goto LAB_00226371;
                    }
                    uVar12 = *(ushort *)(races[0].attrmin + lVar14 + -0x40);
                    if (uVar19 < 0xe) {
                      uVar12 = uVar12 & *psVar20;
                    }
                    if (uVar13 < 6) {
                      uVar12 = uVar12 & *psVar9;
                    }
                    lVar14 = lVar14 + 0x58;
                  } while ((uVar12 & 7) == 0);
                  bVar21 = true;
                }
LAB_00226371:
                __s[(int)uVar15 +
                    ((pnVar6->num_races * (int)uVar19 + (int)uVar13) * pnVar6->num_genders +
                    (int)uVar11) * pnVar6->num_aligns] = bVar21;
              }
            }
          }
        }
      }
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

struct nh_roles_info *nh_get_roles(void)
{
	int i, rolenum, racenum, gendnum, alignnum, arrsize;
	struct nh_roles_info *info = xmalloc(sizeof(struct nh_roles_info));
	const char **names, **names2;
	nh_bool *tmpmatrix;
	
	/* number of choices */
	for (i = 0; roles[i].name.m; i++);
	info->num_roles = i;
	
	for (i = 0; races[i].noun; i++);
	info->num_races = i;
	
	info->num_genders = ROLE_GENDERS;
	info->num_aligns = ROLE_ALIGNS;
	
	/* names of choices */
	names = xmalloc(info->num_roles * sizeof(char*));
	names2 = xmalloc(info->num_roles * sizeof(char*));
	for (i = 0; i < info->num_roles; i++) {
	    names[i]  = roles[i].name.m;
	    names2[i] = roles[i].name.f;
	}
	info->rolenames_m = names;
	info->rolenames_f = names2;

	names = xmalloc(info->num_races * sizeof(char*));
	for (i = 0; i < info->num_races; i++)
	    names[i] = races[i].noun;
	info->racenames = names;
	
	names = xmalloc(info->num_genders * sizeof(char*));
	for (i = 0; i < info->num_genders; i++)
	    names[i] = genders[i].adj;
	info->gendnames = names;
	
	names = xmalloc(info->num_aligns * sizeof(char*));
	for (i = 0; i < info->num_aligns; i++)
	    names[i] = aligns[i].adj;
	info->alignnames = names;
	
	/* default choices */
	info->def_role = flags.init_role;
	info->def_race = flags.init_race;
	info->def_gend = flags.init_gend;
	info->def_align = flags.init_align;
	
	/* valid combinations of choices */
	arrsize = info->num_roles * info->num_races * info->num_genders * info->num_aligns;
	tmpmatrix = xmalloc(arrsize * sizeof(nh_bool));
	memset(tmpmatrix, FALSE, arrsize * sizeof(nh_bool));
	for (rolenum = 0; rolenum < info->num_roles; rolenum++) {
	    for (racenum = 0; racenum < info->num_races; racenum++) {
		if (!ok_race(rolenum, racenum, ROLE_NONE, ROLE_NONE))
		    continue;
		for (gendnum = 0; gendnum < info->num_genders; gendnum++) {
		    if (!ok_gend(rolenum, racenum, gendnum, ROLE_NONE))
			continue;
		    for (alignnum = 0; alignnum < info->num_aligns; alignnum++) {
			tmpmatrix[nh_cm_idx((*info), rolenum, racenum, gendnum, alignnum)] =
			    ok_align(rolenum, racenum, gendnum, alignnum);
		    }
		}
	    }
	}
	info->matrix = tmpmatrix;
	
	return info;
}